

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::Capacity
          (RepeatedField<google::protobuf::UnknownField> *this,bool is_soo)

{
  int local_24;
  bool is_soo_local;
  RepeatedField<google::protobuf::UnknownField> *this_local;
  
  if (is_soo) {
    local_24 = 0;
  }
  else {
    local_24 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  return local_24;
}

Assistant:

int Capacity(bool is_soo) const {
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#endif
    return is_soo ? kSooCapacityElements : soo_rep_.long_rep.capacity;
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }